

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O1

Test * anon_unknown.dwarf_9edf7::CleanTestCleanRule::Create(void)

{
  __node_base_ptr *pp_Var1;
  size_t *psVar2;
  StateTestWithBuiltinRules *this;
  _Rb_tree_header *p_Var3;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x210);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CleanTest_001f7b78;
  this[1].super_Test._vptr_Test = (_func_int **)&PTR__VirtualFileSystem_001fd228;
  pp_Var1 = &this[1].state_.paths_._M_h._M_single_bucket;
  *(undefined4 *)&this[1].state_.paths_._M_h._M_single_bucket = 0;
  *(undefined8 *)&this[1].state_.pools_._M_t._M_impl = 0;
  this[1].super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_Test.field_0x9 = 0;
  this[1].super_Test.assertion_failures_ = 0;
  this[1].state_.paths_._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].state_.paths_._M_h._M_bucket_count = 0;
  this[1].state_.paths_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this[1].state_.paths_._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].state_.paths_._M_h._M_rehash_policy = 0;
  *(__node_base_ptr **)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header = pp_Var1
  ;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pp_Var1;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  psVar2 = &this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)psVar2;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)psVar2;
  this[1].state_.bindings_.super_Env._vptr_Env = (_func_int **)0x0;
  p_Var3 = &this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header;
  this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var3;
  *(_Rb_tree_header **)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var3;
  this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&this[1].state_.bindings_.rules_._M_t._M_impl = 1;
  this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  *(undefined1 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 4) = 0;
  *(undefined4 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 8) = 1;
  *(undefined1 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0xc) = 0;
  *(undefined4 *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = 1;
  *(_Base_ptr *)
   ((long)&this[1].state_.bindings_.rules_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x8000000000000000;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CleanTest_001f7ca0;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(CleanTest, CleanRule) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cat_e\n"
"  command = cat -e $in > $out\n"
"build in1: cat_e src1\n"
"build out1: cat in1\n"
"build in2: cat_e src2\n"
"build out2: cat in2\n"));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanRule("cat_e"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());

  // Check they are removed.
  string err;
  EXPECT_EQ(0, fs_.Stat("in1", &err));
  EXPECT_LT(0, fs_.Stat("out1", &err));
  EXPECT_EQ(0, fs_.Stat("in2", &err));
  EXPECT_LT(0, fs_.Stat("out2", &err));
  fs_.files_removed_.clear();

  ASSERT_EQ(0, cleaner.CleanRule("cat_e"));
  EXPECT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
}